

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

keypress keymap_get_trigger(void)

{
  undefined8 extraout_RDX;
  keypress kVar1;
  char tmp [80];
  undefined1 local_88 [16];
  undefined8 local_78;
  char local_68 [88];
  
  local_88._0_4_ = EVT_NONE;
  local_88._4_4_ = 0;
  local_88._8_8_ = 0;
  local_78 = 0;
  event_signal(EVENT_INPUT_FLUSH);
  kVar1 = inkey();
  local_88._0_8_ = kVar1._0_8_;
  local_88[8] = kVar1.mods;
  keypress_to_text(local_68,0x50,(keypress *)local_88,false);
  Term_addstr(L'\xffffffff',L'\x01',local_68);
  event_signal(EVENT_INPUT_FLUSH);
  kVar1._8_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_88[8]);
  kVar1.type = local_88._0_4_;
  kVar1.code = local_88._4_4_;
  return kVar1;
}

Assistant:

static struct keypress keymap_get_trigger(void)
{
	char tmp[80];
	struct keypress buf[2] = { KEYPRESS_NULL, KEYPRESS_NULL };

	/* Flush */
	event_signal(EVENT_INPUT_FLUSH);

	/* Get a key */
	buf[0] = inkey();

	/* Convert to ascii */
	keypress_to_text(tmp, sizeof(tmp), buf, false);

	/* Hack -- display the trigger */
	Term_addstr(-1, COLOUR_WHITE, tmp);

	/* Flush */
	event_signal(EVENT_INPUT_FLUSH);

	/* Return trigger */
	return buf[0];
}